

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O0

iovec * __thiscall mpt::value::vector(value *this,type_t to)

{
  value *local_50;
  uint local_44;
  value *local_40;
  type_t type;
  iovec *vec;
  type_t to_local;
  value *this_local;
  
  if ((this->_type == 0) || (this->_addr == (void *)0x0)) {
    this_local = (value *)0x0;
  }
  else {
    local_50 = (value *)this->_addr;
    if (to == 0) {
      if ((this->_type < 0x40) || (local_40 = local_50, 0x59 < this->_type)) {
        local_40 = (value *)0x0;
      }
      this_local = local_40;
    }
    else {
      if ((to < 0x60) || (0x7a < to)) {
        local_44 = 0;
      }
      else {
        local_44 = (uint)(byte)((char)to - 0x20);
      }
      if ((long)(int)local_44 == 0) {
        this_local = (value *)0x0;
      }
      else {
        if (this->_type != (long)(int)local_44) {
          local_50 = (value *)0x0;
        }
        this_local = local_50;
      }
    }
  }
  return (iovec *)this_local;
}

Assistant:

const struct iovec *value::vector(type_t to) const
{
	if (!_type || !_addr) {
		return 0;
	}
	const struct iovec *vec = reinterpret_cast<const struct iovec *>(_addr);
	// accept all vector types
	if (!to) {
		return MPT_type_isVector(_type) ? vec : 0;
	}
	type_t type = MPT_type_toVector(to);
	if (!type) {
		return 0;
	}
	// content must match specific type
	return (_type == type) ? vec : 0;
}